

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  DescriptorBuilder *this_00;
  bool bVar1;
  Type TVar2;
  int iVar3;
  Type TVar4;
  string *relative_to;
  MessageOptions *this_01;
  Descriptor *this_02;
  FieldDescriptor *this_03;
  Descriptor *pDVar5;
  FieldDescriptor *extension;
  int i;
  Descriptor *foreign_type;
  FieldDescriptor *field;
  Symbol result;
  Descriptor *descriptor;
  string *name_local;
  Message *message_local;
  AggregateOptionFinder *this_local;
  
  assert_mutex_held(this->builder_->pool_);
  result.ptr_ = (SymbolBase *)Message::GetDescriptor(message);
  this_00 = this->builder_;
  relative_to = Descriptor::full_name_abi_cxx11_((Descriptor *)result.ptr_);
  field = (FieldDescriptor *)LookupSymbolNoPlaceholder(this_00,name,relative_to,LOOKUP_ALL,true);
  this_local = (AggregateOptionFinder *)Symbol::field_descriptor((Symbol *)&field);
  if (this_local == (AggregateOptionFinder *)0x0) {
    TVar2 = Symbol::type((Symbol *)&field);
    if (TVar2 == MESSAGE) {
      this_01 = Descriptor::options((Descriptor *)result.ptr_);
      bVar1 = MessageOptions::message_set_wire_format(this_01);
      if (bVar1) {
        this_02 = Symbol::descriptor((Symbol *)&field);
        for (extension._4_4_ = 0; iVar3 = Descriptor::extension_count(this_02),
            extension._4_4_ < iVar3; extension._4_4_ = extension._4_4_ + 1) {
          this_03 = Descriptor::extension(this_02,extension._4_4_);
          pDVar5 = FieldDescriptor::containing_type(this_03);
          if ((((pDVar5 == (Descriptor *)result.ptr_) &&
               (TVar4 = FieldDescriptor::type(this_03), TVar4 == TYPE_MESSAGE)) &&
              (bVar1 = FieldDescriptor::is_optional(this_03), bVar1)) &&
             (pDVar5 = FieldDescriptor::message_type(this_03), pDVar5 == this_02)) {
            return this_03;
          }
        }
      }
    }
    this_local = (AggregateOptionFinder *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (auto* field = result.field_descriptor()) {
      return field;
    } else if (result.type() == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor();
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }